

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QSettingsGroup>::relocate
          (QArrayDataPointer<QSettingsGroup> *this,qsizetype offset,QSettingsGroup **data)

{
  bool bVar1;
  QSettingsGroup *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  QSettingsGroup *res;
  
  first = (QSettingsGroup *)(*(long *)(in_RDI + 8) + in_RSI * 0x28);
  QtPrivate::q_relocate_overlap_n<QSettingsGroup,long_long>(first,in_RDI,(QSettingsGroup *)0x7c7134)
  ;
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QSettingsGroup>,QSettingsGroup_const*>
                        (data,(QArrayDataPointer<QSettingsGroup> *)res), bVar1)) {
    *in_RDX = in_RSI * 0x28 + *in_RDX;
  }
  *(QSettingsGroup **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }